

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O0

int If_LogCounterAddAig(int *pTimes,int *pnTimes,int *pFaninLits,int Num,int iLit,Vec_Int_t *vAig,
                       int nSuppAll,int fXor,int fXorFunc)

{
  int iVar1;
  int local_4c;
  int t_1;
  int t;
  int k;
  int i;
  int nTimes;
  Vec_Int_t *vAig_local;
  int iLit_local;
  int Num_local;
  int *pFaninLits_local;
  int *pnTimes_local;
  int *pTimes_local;
  
  t_1 = *pnTimes;
  if (vAig != (Vec_Int_t *)0x0) {
    pFaninLits[t_1] = iLit;
  }
  k = t_1 + 1;
  pTimes[t_1] = Num;
  if (1 < k) {
    for (; (0 < t_1 && (pTimes[t_1 + -1] <= pTimes[t_1])); t_1 = t_1 + -1) {
      if (pTimes[t_1 + -1] < pTimes[t_1]) {
        iVar1 = pTimes[t_1];
        pTimes[t_1] = pTimes[t_1 + -1];
        pTimes[t_1 + -1] = iVar1;
        if (vAig != (Vec_Int_t *)0x0) {
          iVar1 = pFaninLits[t_1];
          pFaninLits[t_1] = pFaninLits[t_1 + -1];
          pFaninLits[t_1 + -1] = iVar1;
        }
      }
      else {
        pTimes[t_1 + -1] = fXor + 1 + pTimes[t_1 + -1];
        if (vAig != (Vec_Int_t *)0x0) {
          iVar1 = If_LogCreateAndXor(vAig,pFaninLits[t_1],pFaninLits[t_1 + -1],nSuppAll,fXorFunc);
          pFaninLits[t_1 + -1] = iVar1;
        }
        k = k + -1;
        for (t = t_1; t < k; t = t + 1) {
          pTimes[t] = pTimes[t + 1];
          if (vAig != (Vec_Int_t *)0x0) {
            pFaninLits[t] = pFaninLits[t + 1];
          }
        }
      }
    }
  }
  if (k < 1) {
    __assert_fail("nTimes > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCount.h"
                  ,0x77,
                  "int If_LogCounterAddAig(int *, int *, int *, int, int, Vec_Int_t *, int, int, int)"
                 );
  }
  *pnTimes = k;
  if (k < 2) {
    local_4c = 0;
  }
  else {
    local_4c = fXor + 1;
  }
  return *pTimes + local_4c;
}

Assistant:

static inline int If_LogCounterAddAig( int * pTimes, int * pnTimes, int * pFaninLits, int Num, int iLit, Vec_Int_t * vAig, int nSuppAll, int fXor, int fXorFunc )
{
    int nTimes = *pnTimes;
    if ( vAig )
        pFaninLits[nTimes] = iLit;
    pTimes[nTimes++] = Num;
    if ( nTimes > 1 )
    {
        int i, k;
        for ( k = nTimes-1; k > 0; k-- )
        {
            if ( pTimes[k] < pTimes[k-1] )
                break;
            if ( pTimes[k] > pTimes[k-1] )
            { 
                ABC_SWAP( int, pTimes[k], pTimes[k-1] ); 
                if ( vAig )
                    ABC_SWAP( int, pFaninLits[k], pFaninLits[k-1] ); 
                continue; 
            }
            pTimes[k-1] += 1 + fXor;
            if ( vAig )
                pFaninLits[k-1] = If_LogCreateAndXor( vAig, pFaninLits[k], pFaninLits[k-1], nSuppAll, fXorFunc );
            for ( nTimes--, i = k; i < nTimes; i++ )
            {
                pTimes[i] = pTimes[i+1];
                if ( vAig )
                    pFaninLits[i] = pFaninLits[i+1];
            }
        }
    }
    assert( nTimes > 0 );
    *pnTimes = nTimes;
    return pTimes[0] + (nTimes > 1 ? 1 + fXor : 0);
}